

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_store(irGenerator *this,LeftVal *dest,RightVal *src)

{
  LabelId LVar1;
  LeftVal *leftVal;
  StoreInst *in_RSI;
  shared_ptr<mir::inst::StoreInst> storeInst;
  shared_ptr<mir::inst::Value> srcValue;
  shared_ptr<mir::inst::VarId> destVarId;
  StoreInst *in_stack_fffffffffffffe98;
  value_type *__x;
  Value *in_stack_fffffffffffffea0;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *this_00;
  VarId *dest_00;
  undefined4 in_stack_fffffffffffffed8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff50;
  irGenerator *in_stack_ffffffffffffff58;
  VarId local_58 [5];
  
  std::shared_ptr<mir::inst::VarId>::shared_ptr((shared_ptr<mir::inst::VarId> *)0x262173);
  std::shared_ptr<mir::inst::Value>::shared_ptr((shared_ptr<mir::inst::Value> *)0x262180);
  std::shared_ptr<mir::inst::StoreInst>::shared_ptr((shared_ptr<mir::inst::StoreInst> *)0x26218d);
  leftVal = (LeftVal *)operator_new(0x10);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffea0,
          (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffe98);
  LVar1 = LeftValueToLabelId((irGenerator *)in_stack_ffffffffffffff00,leftVal);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffffea0,(uint32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20)
            );
  std::shared_ptr<mir::inst::VarId>::shared_ptr<mir::inst::VarId,void>
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffea0,
             (VarId *)in_stack_fffffffffffffe98);
  dest_00 = local_58;
  std::shared_ptr<mir::inst::VarId>::operator=
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffea0,
             (shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe98);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x262222);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x26222f);
  rightValueToValue(in_stack_ffffffffffffff58,(RightVal *)in_stack_ffffffffffffff50);
  std::shared_ptr<mir::inst::Value>::operator=
            ((shared_ptr<mir::inst::Value> *)in_stack_fffffffffffffea0,
             (shared_ptr<mir::inst::Value> *)in_stack_fffffffffffffe98);
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x26226c);
  operator_new(0x38);
  std::__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffea0);
  mir::inst::Value::Value(in_stack_fffffffffffffea0,(Value *)in_stack_fffffffffffffe98);
  std::__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffea0);
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffea0,(VarId *)in_stack_fffffffffffffe98);
  mir::inst::StoreInst::StoreInst(in_RSI,(Value *)CONCAT44(LVar1,in_stack_fffffffffffffed8),dest_00)
  ;
  std::shared_ptr<mir::inst::StoreInst>::shared_ptr<mir::inst::StoreInst,void>
            ((shared_ptr<mir::inst::StoreInst> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
            );
  this_00 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
             *)&stack0xffffffffffffff48;
  std::shared_ptr<mir::inst::StoreInst>::operator=
            ((shared_ptr<mir::inst::StoreInst> *)this_00,
             (shared_ptr<mir::inst::StoreInst> *)in_stack_fffffffffffffe98);
  std::shared_ptr<mir::inst::StoreInst>::~shared_ptr((shared_ptr<mir::inst::StoreInst> *)0x26230f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
                *)in_RSI,(key_type *)CONCAT44(LVar1,in_stack_fffffffffffffed8));
  __x = (value_type *)&stack0xffffffffffffff00;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::variant<std::shared_ptr<mir::inst::StoreInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
            (this_00,(shared_ptr<mir::inst::StoreInst> *)__x);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_00,__x);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x262370);
  std::shared_ptr<mir::inst::StoreInst>::~shared_ptr((shared_ptr<mir::inst::StoreInst> *)0x26237d);
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x26238a);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x262397);
  return;
}

Assistant:

void irGenerator::ir_store(LeftVal dest, RightVal src) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> srcValue;
  shared_ptr<mir::inst::StoreInst> storeInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  srcValue = rightValueToValue(src);

  storeInst = shared_ptr<mir::inst::StoreInst>(
      new mir::inst::StoreInst(*srcValue, *destVarId));

  _funcNameToInstructions[_funcStack.back()].push_back(storeInst);
}